

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

int64 __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback
          (CodedInputStream *this,uint32 first_byte_or_zero)

{
  long lVar1;
  uint8 *puVar2;
  uint8 *puVar3;
  uint uVar4;
  ulong uVar5;
  uint8 *puVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  pair<unsigned_long,_bool> pVar11;
  
  puVar6 = this->buffer_;
  puVar3 = this->buffer_end_;
  if (((int)puVar3 - (int)puVar6 < 10) && ((puVar3 <= puVar6 || ((char)puVar3[-1] < '\0')))) {
    pVar11 = ReadVarint64Fallback(this);
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return -1;
    }
    return (ulong)(uint)pVar11.first;
  }
  uVar4 = ((uint)puVar6[1] * 0x80 + first_byte_or_zero) - 0x80;
  if ((char)puVar6[1] < '\0') {
    uVar4 = (uVar4 + (uint)puVar6[2] * 0x4000) - 0x4000;
    if ((char)puVar6[2] < '\0') {
      uVar4 = (uVar4 + (uint)puVar6[3] * 0x200000) - 0x200000;
      if ((char)puVar6[3] < '\0') {
        uVar4 = uVar4 + (uint)puVar6[4] * 0x10000000 + 0xf0000000;
        if ((char)puVar6[4] < '\0') {
          puVar3 = puVar6 + 6;
          if ((char)puVar6[5] < '\0') {
            puVar6 = puVar6 + 10;
            lVar9 = 0;
            do {
              uVar8 = (uint)lVar9;
              if (uVar8 == 4) goto LAB_00280aa4;
              lVar1 = lVar9 + 1;
              puVar2 = puVar3 + lVar9;
              lVar9 = lVar1;
            } while ((char)*puVar2 < '\0');
            puVar6 = puVar3 + lVar1;
LAB_00280aa4:
            bVar10 = 3 < uVar8;
          }
          else {
            bVar10 = false;
            puVar6 = puVar3;
          }
          if (bVar10) {
            uVar7 = 0;
            bVar10 = false;
            goto LAB_00280a61;
          }
        }
        else {
          puVar6 = puVar6 + 5;
        }
      }
      else {
        puVar6 = puVar6 + 4;
      }
    }
    else {
      puVar6 = puVar6 + 3;
    }
  }
  else {
    puVar6 = puVar6 + 2;
  }
  uVar7 = (ulong)uVar4;
  bVar10 = true;
LAB_00280a61:
  uVar5 = 0xffffffffffffffff;
  if (bVar10) {
    this->buffer_ = puVar6;
    uVar5 = uVar7;
  }
  return uVar5;
}

Assistant:

int64 CodedInputStream::ReadVarint32Fallback(uint32 first_byte_or_zero) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    GOOGLE_DCHECK_NE(first_byte_or_zero, 0)
        << "Caller should provide us with *buffer_ when buffer is non-empty";
    uint32 temp;
    ::std::pair<bool, const uint8*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &temp);
    if (!p.first) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    uint32 temp;
    return ReadVarint32Slow(&temp) ? static_cast<int64>(temp) : -1;
  }
}